

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O3

void QtPrivate::q_relocate_overlap_n_left_move<QShaderDescription::UniformBlock*,long_long>
               (UniformBlock *first,longlong n,UniformBlock *d_first)

{
  Data *pDVar1;
  char *pcVar2;
  qsizetype qVar3;
  Data *pDVar4;
  BlockVariable *pBVar5;
  UniformBlock *pUVar6;
  QArrayDataPointer<QShaderDescription::BlockVariable> *pQVar7;
  int iVar8;
  QArrayDataPointer<QShaderDescription::BlockVariable> *this;
  UniformBlock *pUVar9;
  UniformBlock *pUVar10;
  UniformBlock *pUVar11;
  long in_FS_OFFSET;
  Destructor local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.iter = &local_48.intermediate;
  pUVar9 = d_first + n;
  pUVar11 = first;
  pUVar6 = pUVar9;
  if (first < pUVar9) {
    pUVar11 = pUVar9;
    pUVar6 = first;
  }
  pUVar10 = d_first;
  if (pUVar6 != d_first) {
    do {
      pDVar1 = (first->blockName).d.d;
      (first->blockName).d.d = (Data *)0x0;
      (pUVar10->blockName).d.d = pDVar1;
      pcVar2 = (first->blockName).d.ptr;
      (first->blockName).d.ptr = (char *)0x0;
      (pUVar10->blockName).d.ptr = pcVar2;
      qVar3 = (first->blockName).d.size;
      (first->blockName).d.size = 0;
      (pUVar10->blockName).d.size = qVar3;
      pDVar1 = (first->structName).d.d;
      (first->structName).d.d = (Data *)0x0;
      (pUVar10->structName).d.d = pDVar1;
      pcVar2 = (first->structName).d.ptr;
      (first->structName).d.ptr = (char *)0x0;
      (pUVar10->structName).d.ptr = pcVar2;
      qVar3 = (first->structName).d.size;
      (first->structName).d.size = 0;
      (pUVar10->structName).d.size = qVar3;
      iVar8 = first->binding;
      pUVar10->size = first->size;
      pUVar10->binding = iVar8;
      pUVar10->descriptorSet = first->descriptorSet;
      pDVar4 = (first->members).d.d;
      (first->members).d.d = (Data *)0x0;
      (pUVar10->members).d.d = pDVar4;
      pBVar5 = (first->members).d.ptr;
      (first->members).d.ptr = (BlockVariable *)0x0;
      (pUVar10->members).d.ptr = pBVar5;
      qVar3 = (first->members).d.size;
      (first->members).d.size = 0;
      (pUVar10->members).d.size = qVar3;
      pUVar10 = pUVar10 + 1;
      first = first + 1;
    } while (pUVar10 != pUVar6);
  }
  local_48.end = d_first;
  local_48.intermediate = pUVar10;
  for (; pUVar10 != pUVar9; pUVar10 = pUVar10 + 1) {
    pDVar1 = (pUVar10->blockName).d.d;
    (pUVar10->blockName).d.d = (first->blockName).d.d;
    (first->blockName).d.d = pDVar1;
    pcVar2 = (pUVar10->blockName).d.ptr;
    (pUVar10->blockName).d.ptr = (first->blockName).d.ptr;
    (first->blockName).d.ptr = pcVar2;
    qVar3 = (pUVar10->blockName).d.size;
    (pUVar10->blockName).d.size = (first->blockName).d.size;
    (first->blockName).d.size = qVar3;
    pDVar1 = (pUVar10->structName).d.d;
    (pUVar10->structName).d.d = (first->structName).d.d;
    (first->structName).d.d = pDVar1;
    pcVar2 = (pUVar10->structName).d.ptr;
    (pUVar10->structName).d.ptr = (first->structName).d.ptr;
    (first->structName).d.ptr = pcVar2;
    qVar3 = (pUVar10->structName).d.size;
    (pUVar10->structName).d.size = (first->structName).d.size;
    (first->structName).d.size = qVar3;
    pUVar10->descriptorSet = first->descriptorSet;
    iVar8 = first->binding;
    pUVar10->size = first->size;
    pUVar10->binding = iVar8;
    QArrayDataPointer<QShaderDescription::BlockVariable>::operator=
              (&(pUVar10->members).d,&(first->members).d);
    first = first + 1;
  }
  local_48.iter = &local_48.end;
  if (first != pUVar11) {
    this = &first[-1].members.d;
    do {
      QArrayDataPointer<QShaderDescription::BlockVariable>::~QArrayDataPointer(this);
      pBVar5 = this[-2].ptr;
      if (pBVar5 != (BlockVariable *)0x0) {
        LOCK();
        *(int *)&(pBVar5->name).d.d = *(int *)&(pBVar5->name).d.d + -1;
        UNLOCK();
        if (*(int *)&(pBVar5->name).d.d == 0) {
          QArrayData::deallocate((QArrayData *)this[-2].ptr,1,0x10);
        }
      }
      pBVar5 = this[-3].ptr;
      if (pBVar5 != (BlockVariable *)0x0) {
        LOCK();
        *(int *)&(pBVar5->name).d.d = *(int *)&(pBVar5->name).d.d + -1;
        UNLOCK();
        if (*(int *)&(pBVar5->name).d.d == 0) {
          QArrayData::deallocate((QArrayData *)this[-3].ptr,1,0x10);
        }
      }
      pQVar7 = this + -3;
      this = (QArrayDataPointer<QShaderDescription::BlockVariable> *)&this[-4].ptr;
    } while ((UniformBlock *)&pQVar7->ptr != pUVar11);
  }
  q_relocate_overlap_n_left_move<QShaderDescription::UniformBlock_*,_long_long>::Destructor::
  ~Destructor(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}